

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_type(Dispatch_Engine *this,Type_Info *type)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  string local_40;
  
  bVar3 = (type->m_flags & 1) == 0;
  pcVar2 = "const ";
  if (bVar3) {
    pcVar2 = "";
  }
  lVar1 = 6;
  if (bVar3) {
    lVar1 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  get_type_name_abi_cxx11_(&local_40,this,type);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void dump_type(const Type_Info &type) const { std::cout << (type.is_const() ? "const " : "") << get_type_name(type); }